

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alp.hpp
# Opt level: O1

bool duckdb::alp::AlpCompression<float,_true>::IsImpossibleToEncode(float n)

{
  undefined1 auVar1 [16];
  bool bVar2;
  uint uVar3;
  undefined8 unaff_RBX;
  ulong uVar4;
  undefined4 in_XMM0_Db;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  
  bVar2 = Value::IsFinite<float>(n);
  uVar4 = CONCAT71((int7)((ulong)unaff_RBX >> 8),1);
  if (bVar2) {
    bVar2 = Value::IsNan<float>(n);
    if ((!bVar2) && (ABS(n) <= 9.223372e+18)) {
      if ((n != 0.0) || (NAN(n))) {
        uVar4 = 0;
      }
      else {
        auVar1._4_4_ = in_XMM0_Db;
        auVar1._0_4_ = n;
        auVar1._8_4_ = in_XMM0_Dc;
        auVar1._12_4_ = in_XMM0_Dd;
        uVar3 = movmskps((int)uVar4,auVar1);
        uVar4 = (ulong)(uVar3 & 1);
      }
    }
  }
  return SUB81(uVar4,0);
}

Assistant:

static bool IsImpossibleToEncode(T n) {
		return !Value::IsFinite(n) || Value::IsNan(n) || n > AlpConstants::ENCODING_UPPER_LIMIT ||
		       n < AlpConstants::ENCODING_LOWER_LIMIT || (n == 0.0 && std::signbit(n)); //! Verification for -0.0
	}